

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O3

int av1_cost_coeffs_txb(MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,
                       TXB_CTX *txb_ctx,int reduced_tx_set_used)

{
  TX_CLASS tx_class;
  char cVar1;
  ushort eob;
  short sVar2;
  int16_t *scan;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  tran_low_t *ptVar18;
  int iVar19;
  int iVar20;
  LV_MAP_COEFF_COST *txb_costs;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  uint8_t levels_buf [1312];
  byte local_159c;
  byte local_1558 [1312];
  int8_t local_1038 [4104];
  
  eob = x->plane[plane].eobs[block];
  uVar12 = CONCAT71(in_register_00000009,tx_size) & 0xffffffff;
  uVar16 = (uint)""[uVar12] + (uint)""[uVar12] + 1 >> 1 & 0xff;
  bVar22 = plane != 0;
  txb_costs = (x->coeff_costs).coeff_costs[uVar16] + bVar22;
  if (eob == 0) {
    return (x->coeff_costs).coeff_costs[uVar16][bVar22].txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }
  uVar14 = (ulong)tx_type;
  tx_class = ""[uVar14];
  ptVar18 = x->plane[plane].qcoeff + (block << 4);
  uVar7 = 10;
  iVar3 = 0x20;
  if (tx_size < 0x11) {
    uVar8 = 3;
    if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
LAB_0024a8a5:
      uVar8 = uVar12;
    }
    local_159c = (byte)tx_size_high_log2[uVar8];
    if (tx_size < 0x11) {
      uVar8 = 3;
      if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
        uVar8 = uVar12;
      }
    }
    else {
      if (tx_size == '\x11') goto LAB_0024a90b;
      uVar8 = uVar12;
      if (tx_size == '\x12') goto LAB_0024a92d;
    }
    iVar3 = tx_size_wide[uVar8];
    if (tx_size < 0x11) {
      uVar7 = 3;
      if ((1 < tx_size - 0xb) && (tx_size != '\x04')) {
LAB_0024a923:
        uVar7 = uVar12;
      }
    }
    else if (tx_size == '\x11') {
      uVar7 = 9;
    }
    else if (tx_size != '\x12') goto LAB_0024a923;
  }
  else {
    local_159c = 5;
    if (tx_size == '\x11') {
LAB_0024a90b:
      uVar7 = 9;
      iVar3 = 0x10;
    }
    else {
      local_159c = 4;
      if (tx_size != '\x12') goto LAB_0024a8a5;
    }
  }
LAB_0024a92d:
  scan = *(int16_t **)
          ((long)&av1_scan_orders[0][tx_type].scan +
          (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_size) << 8));
  cVar1 = ""[uVar12];
  iVar17 = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
  (*av1_txb_init_levels)(ptVar18,iVar3,tx_size_high[uVar7],local_1558);
  iVar3 = get_tx_type_cost(x,&x->e_mbd,plane,tx_size,tx_type,reduced_tx_set_used);
  iVar4 = get_eob_cost((uint)eob,(x->coeff_costs).eob_costs[cVar1] + bVar22,txb_costs,tx_class);
  av1_get_nz_map_contexts_sse2(local_1558,scan,eob,tx_size,tx_class,local_1038);
  uVar21 = eob - 1;
  sVar2 = scan[uVar21];
  uVar6 = ptVar18[sVar2];
  uVar5 = -uVar6;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  uVar12 = 3;
  if (uVar5 < 3) {
    uVar12 = (ulong)uVar5;
  }
  iVar3 = iVar4 + iVar3 + iVar17 +
          txb_costs->base_eob_cost[(long)local_1038[sVar2] + -1][uVar12 + 2];
  if (uVar6 != 0) {
    if (2 < uVar5) {
      iVar4 = (int)sVar2 >> (local_159c & 0x1f);
      iVar17 = iVar4 << (local_159c & 0x1f);
      if (sVar2 == 0) {
        lVar13 = 0;
      }
      else {
        lVar13 = 7;
        if ((((9 < tx_type) || (1 < sVar2 - iVar17)) || (1 < iVar4)) &&
           (((0xa800UL >> (uVar14 & 0x3f) & 1) == 0 || (iVar4 != 0)))) {
          if (sVar2 != iVar17) {
            lVar13 = 0xe;
          }
          if ((0x5400UL >> (uVar14 & 0x3f) & 1) == 0) {
            lVar13 = 0xe;
          }
        }
      }
      uVar11 = 0x1f;
      if (uVar5 - 0xe != 0) {
        for (; uVar5 - 0xe >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = (uVar11 ^ 0x1f) << 10 ^ 0x7e00;
      uVar12 = 0xf;
      if (uVar5 < 0xf) {
        uVar12 = (ulong)uVar5;
        uVar11 = 0;
      }
      iVar3 = uVar11 + iVar3 +
              (x->coeff_costs).coeff_costs[uVar16][bVar22].lps_cost[lVar13 + -1][uVar12 + 0x17];
    }
    if (uVar21 == 0) {
      return iVar3 + txb_costs->dc_sign_cost[txb_ctx->dc_sign_ctx][uVar6 >> 0x1f];
    }
    iVar3 = iVar3 + 0x200;
  }
  uVar21 = eob - 2;
  if (2 < eob) {
    iVar17 = 1 << (local_159c & 0x1f);
    iVar4 = iVar17 + 4;
    lVar13 = (ulong)uVar21 + 1;
    do {
      sVar2 = scan[lVar13 + -1];
      uVar6 = ptVar18[sVar2];
      uVar5 = -uVar6;
      if (0 < (int)uVar6) {
        uVar5 = uVar6;
      }
      uVar12 = (ulong)uVar5;
      uVar14 = 3;
      if (uVar5 < 3) {
        uVar14 = (ulong)uVar5;
      }
      iVar3 = iVar3 + (x->coeff_costs).coeff_costs[uVar16][bVar22].base_cost[local_1038[sVar2]]
                      [uVar14];
      if ((uVar6 != 0) && (iVar3 = iVar3 + 0x200, 2 < uVar5)) {
        iVar10 = (int)sVar2 >> (local_159c & 0x1f);
        iVar9 = iVar10 << (local_159c & 0x1f);
        iVar19 = sVar2 - iVar9;
        iVar20 = iVar10 * iVar4 + iVar19;
        lVar15 = (long)(iVar4 + iVar20);
        uVar6 = (uint)local_1558[lVar15] + (uint)local_1558[(long)iVar20 + 1];
        if (tx_class == '\x02') {
          uVar6 = uVar6 + local_1558[(long)iVar20 + 2] + 1 >> 1;
          if (5 < uVar6) {
            uVar6 = 6;
          }
          if (sVar2 != 0) {
            bVar23 = sVar2 == iVar9;
LAB_0024ac9c:
            if (!bVar23) goto LAB_0024acba;
            uVar6 = uVar6 + 7;
          }
        }
        else if (tx_class == '\x01') {
          uVar6 = uVar6 + local_1558[iVar20 + iVar17 * 2 + 8] + 1 >> 1;
          if (5 < uVar6) {
            uVar6 = 6;
          }
          if (sVar2 != 0) {
            bVar23 = iVar10 == 0;
            goto LAB_0024ac9c;
          }
        }
        else if (tx_class == '\0') {
          uVar6 = uVar6 + local_1558[lVar15 + 1] + 1 >> 1;
          if (5 < uVar6) {
            uVar6 = 6;
          }
          if (sVar2 != 0) {
            if ((1 < iVar10) || (1 < iVar19)) goto LAB_0024acba;
            uVar6 = uVar6 + 7;
          }
        }
        else {
LAB_0024acba:
          uVar6 = uVar6 + 0xe;
        }
        uVar11 = 0x1f;
        if (uVar5 - 0xe != 0) {
          for (; uVar5 - 0xe >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar11 = (uVar11 ^ 0x1f) << 10 ^ 0x7e00;
        if (uVar5 < 0xf) {
          uVar11 = 0;
        }
        else {
          uVar12 = 0xf;
        }
        iVar3 = uVar11 + iVar3 +
                (x->coeff_costs).coeff_costs[uVar16][bVar22].lps_cost[(ulong)uVar6 - 1]
                [uVar12 + 0x17];
      }
      lVar13 = lVar13 + -1;
      uVar21 = uVar21 - 1;
    } while (1 < lVar13);
  }
  sVar2 = scan[(int)uVar21];
  uVar21 = ptVar18[sVar2];
  uVar6 = -uVar21;
  if (0 < (int)uVar21) {
    uVar6 = uVar21;
  }
  uVar12 = 3;
  if (uVar6 < 3) {
    uVar12 = (ulong)uVar6;
  }
  iVar3 = iVar3 + (x->coeff_costs).coeff_costs[uVar16][bVar22].base_cost[local_1038[sVar2]][uVar12];
  if (uVar21 == 0) {
    return iVar3;
  }
  iVar3 = iVar3 + txb_costs->dc_sign_cost[txb_ctx->dc_sign_ctx][uVar21 >> 0x1f];
  if (uVar6 < 3) {
    return iVar3;
  }
  iVar9 = (int)sVar2 >> (local_159c & 0x1f);
  iVar19 = iVar9 << (local_159c & 0x1f);
  iVar4 = 1 << (local_159c & 0x1f);
  iVar10 = sVar2 - iVar19;
  iVar17 = iVar4 + 4;
  iVar20 = iVar9 * iVar17 + iVar10;
  lVar13 = (long)(iVar4 + iVar20 + 4);
  uVar21 = (uint)local_1558[lVar13] + (uint)local_1558[(long)iVar20 + 1];
  if (tx_class == '\x02') {
    uVar5 = local_1558[(long)iVar20 + 2] + uVar21 + 1 >> 1;
    uVar21 = 6;
    if (uVar5 < 6) {
      uVar21 = uVar5;
    }
    if (sVar2 == 0) goto LAB_0024ae51;
    if (sVar2 == iVar19) {
LAB_0024ae4e:
      uVar21 = uVar21 + 7;
      goto LAB_0024ae51;
    }
  }
  else if (tx_class == '\x01') {
    uVar5 = local_1558[iVar20 + iVar17 * 2] + uVar21 + 1 >> 1;
    uVar21 = 6;
    if (uVar5 < 6) {
      uVar21 = uVar5;
    }
    if (sVar2 == 0) goto LAB_0024ae51;
    if (iVar9 == 0) goto LAB_0024ae4e;
  }
  else if (tx_class == '\0') {
    uVar5 = local_1558[lVar13 + 1] + uVar21 + 1 >> 1;
    uVar21 = 6;
    if (uVar5 < 6) {
      uVar21 = uVar5;
    }
    if (sVar2 == 0) goto LAB_0024ae51;
    if ((iVar9 < 2) && (iVar10 < 2)) goto LAB_0024ae4e;
  }
  uVar21 = uVar21 + 0xe;
LAB_0024ae51:
  uVar5 = 0x1f;
  if (uVar6 - 0xe != 0) {
    for (; uVar6 - 0xe >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar5 = (uVar5 ^ 0x1f) << 10 ^ 0x7e00;
  uVar12 = 0xf;
  if (uVar6 < 0xf) {
    uVar12 = (ulong)uVar6;
    uVar5 = 0;
  }
  return iVar3 + uVar5 +
         (x->coeff_costs).coeff_costs[uVar16][bVar22].lps_cost[(ulong)uVar21 - 1][uVar12 + 0x17];
}

Assistant:

int av1_cost_coeffs_txb(const MACROBLOCK *x, const int plane, const int block,
                        const TX_SIZE tx_size, const TX_TYPE tx_type,
                        const TXB_CTX *const txb_ctx, int reduced_tx_set_used) {
  const struct macroblock_plane *p = &x->plane[plane];
  const int eob = p->eobs[block];
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const LV_MAP_COEFF_COST *const coeff_costs =
      &x->coeff_costs.coeff_costs[txs_ctx][plane_type];
  if (eob == 0) {
    return coeff_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }

  const MACROBLOCKD *const xd = &x->e_mbd;
  const TX_CLASS tx_class = tx_type_to_class[tx_type];

  return warehouse_efficients_txb(x, plane, block, tx_size, txb_ctx, p, eob,
                                  plane_type, coeff_costs, xd, tx_type,
                                  tx_class, reduced_tx_set_used);
}